

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::deleteMaterialRenders(CNullDriver *this)

{
  u32 uVar1;
  SMaterialRenderer *pSVar2;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                      ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x309184);
    if (uVar1 <= uVar3) break;
    pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                       ((array<irr::video::CNullDriver::SMaterialRenderer> *)
                        CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    if (pSVar2->Renderer != (IMaterialRenderer *)0x0) {
      core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                ((array<irr::video::CNullDriver::SMaterialRenderer> *)
                 CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
    }
    uVar3 = uVar4 + 1;
  }
  core::array<irr::video::CNullDriver::SMaterialRenderer>::clear
            ((array<irr::video::CNullDriver::SMaterialRenderer> *)
             CONCAT44(uVar4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CNullDriver::deleteMaterialRenders()
{
	// delete material renderers
	for (u32 i = 0; i < MaterialRenderers.size(); ++i)
		if (MaterialRenderers[i].Renderer)
			MaterialRenderers[i].Renderer->drop();

	MaterialRenderers.clear();
}